

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_input(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_buffer_t *decryptbuf,void *input,
                size_t *inlen,ptls_handshake_properties_t *properties)

{
  anon_struct_64_2_7cec4369_for_recvbuf *buf;
  uint64_t *puVar1;
  undefined1 *puVar2;
  bool bVar3;
  size_t input_00;
  int iVar4;
  st_ptls_traffic_protection_t *psVar5;
  uint32_t uVar6;
  ulong uVar7;
  st_ptls_traffic_protection_t *inlen_00;
  uint8_t uVar8;
  uint uVar9;
  uint uVar10;
  ptls_handshake_properties_t *properties_00;
  ulong uVar11;
  uint8_t *puVar12;
  ulong __n;
  uint8_t *puVar13;
  ptls_message_emitter_t local_88;
  ptls_handshake_properties_t *local_60;
  uint8_t *local_58;
  undefined2 local_4d;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  ptls_buffer_t *local_48;
  ulong local_40;
  st_ptls_traffic_protection_t *local_38;
  
  properties_00 = (ptls_handshake_properties_t *)inlen;
  if ((tls->field_0x160 & 0x20) == 0) {
    buf = &tls->recvbuf;
    puVar12 = (tls->recvbuf).rec.base;
    puVar2 = (undefined1 *)*inlen;
    local_88.commit_message = (_func_int_st_ptls_message_emitter_t_ptr *)emitter;
    local_60 = properties;
    if (puVar2 < (undefined1 *)0x5 || puVar12 != (uint8_t *)0x0) {
      local_88.record_header_length = 0;
      local_88.buf = (ptls_buffer_t *)0x0;
      local_88.enc = (st_ptls_traffic_protection_t *)0x0;
      if (puVar12 == (uint8_t *)0x0) goto LAB_0010fa97;
LAB_0010fad0:
      puVar12 = puVar2 + (long)input;
      uVar11 = (long)puVar12 - (long)input;
      while (uVar7 = (tls->recvbuf).rec.off, uVar7 < 5) {
        if ((uint8_t *)input == puVar12) {
          return 0x202;
        }
        uVar8 = *input;
        input = (void *)((long)input + 1);
        puVar13 = (tls->recvbuf).rec.base;
        (tls->recvbuf).rec.off = uVar7 + 1;
        puVar13[uVar7] = uVar8;
        uVar11 = uVar11 - 1;
      }
      local_58 = (buf->rec).base;
      local_48 = &buf->rec;
      iVar4 = parse_record_header((st_ptls_record_t *)&local_88,local_58);
      if (iVar4 != 0) {
        return iVar4;
      }
      local_38 = local_88.enc;
      uVar7 = (long)((local_88.enc)->secret + 5) - uVar7;
      puVar13 = local_58;
      if (uVar7 == 0) {
LAB_0010fb52:
        local_88.record_header_length = (size_t)(puVar13 + 5);
        iVar4 = 0;
        bVar3 = true;
      }
      else {
        local_58 = (local_88.enc)->secret + 5;
        iVar4 = ptls_buffer_reserve(local_48,uVar7);
        if (iVar4 != 0) {
          return iVar4;
        }
        __n = uVar11;
        if (uVar7 < uVar11) {
          __n = uVar7;
        }
        puVar13 = (uint8_t *)(tls->recvbuf).rec.off;
        if (__n != 0) {
          local_40 = uVar7;
          memcpy(puVar13 + (long)(tls->recvbuf).rec.base,input,__n);
          puVar13 = (uint8_t *)(__n + (tls->recvbuf).rec.off);
          (tls->recvbuf).rec.off = (size_t)puVar13;
          uVar7 = local_40;
          if (uVar11 < local_40) {
            uVar7 = uVar11;
          }
          input = (void *)((long)input + uVar7);
        }
        if (puVar13 == local_58) {
          puVar13 = local_48->base;
          goto LAB_0010fb52;
        }
        iVar4 = 0x202;
        bVar3 = false;
      }
      *inlen = (size_t)((long)input + (*inlen - (long)puVar12));
      if (!bVar3) {
        return iVar4;
      }
      inlen_00 = local_38;
      if ((uint8_t *)local_88.record_header_length == (uint8_t *)0x0) {
        __assert_fail("rec.fragment != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                      ,0x11a7,
                      "int handle_input(ptls_t *, ptls_message_emitter_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                     );
      }
    }
    else {
      iVar4 = parse_record_header((st_ptls_record_t *)&local_88,(uint8_t *)input);
      if (iVar4 != 0) {
        return iVar4;
      }
      if (puVar2 < (local_88.enc)->secret + 5) {
LAB_0010fa97:
        local_88.record_header_length = 0;
        local_88.enc = (st_ptls_traffic_protection_t *)0x0;
        local_88.buf = (ptls_buffer_t *)0x0;
        (tls->recvbuf).rec.base = "";
        (tls->recvbuf).rec.capacity = 0;
        (tls->recvbuf).rec.off = 0;
        (tls->recvbuf).rec.is_allocated = 0;
        iVar4 = ptls_buffer_reserve(&buf->rec,5);
        if (iVar4 != 0) {
          return iVar4;
        }
        goto LAB_0010fad0;
      }
      local_88.record_header_length = (long)input + 5;
      *inlen = (size_t)((local_88.enc)->secret + 5);
      inlen_00 = local_88.enc;
    }
    properties = local_60;
    input_00 = local_88.record_header_length;
    if ((uint8_t)local_88.buf == '\x14') {
      if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
        return 0x28;
      }
      if (inlen_00 != (st_ptls_traffic_protection_t *)0x1) {
        return 0x2f;
      }
      uVar9 = 0x202;
      if (*(uint8_t *)local_88.record_header_length != '\x01') {
        return 0x2f;
      }
      goto LAB_0010fdb3;
    }
    if (((uint8_t)local_88.buf == '\x15') ||
       ((tls->traffic_protection).dec.aead == (ptls_aead_context_t *)0x0)) {
      uVar8 = (uint8_t)local_88.buf;
      if (((uint8_t)local_88.buf == '\x17') &&
         ((uVar8 = '\x17', (tls->field_0x160 & 1) != 0 &&
          (uVar6 = (tls->field_20).server.early_data_skipped_bytes, uVar6 != 0xffffffff))))
      goto LAB_0010fde8;
    }
    else {
      if ((uint8_t)local_88.buf != '\x17') {
        return 0x28;
      }
      iVar4 = ptls_buffer_reserve(decryptbuf,(size_t)(inlen_00->secret + 5));
      if (iVar4 != 0) {
        return iVar4;
      }
      local_4d = 0x317;
      local_4b = 3;
      local_4a = (undefined1)((ulong)inlen_00 >> 8);
      local_49 = SUB81(inlen_00,0);
      properties_00 = (ptls_handshake_properties_t *)(tls->traffic_protection).dec.seq;
      psVar5 = (st_ptls_traffic_protection_t *)
               ptls_aead_decrypt((tls->traffic_protection).dec.aead,
                                 decryptbuf->base + decryptbuf->off,(void *)input_00,
                                 (size_t)inlen_00,(uint64_t)properties_00,&local_4d,5);
      if (psVar5 == (st_ptls_traffic_protection_t *)0xffffffffffffffff) {
        if ((tls->field_0x160 & 1) == 0) {
          return 0x14;
        }
        uVar6 = (tls->field_20).server.early_data_skipped_bytes;
        if (uVar6 == 0xffffffff) {
          return 0x14;
        }
LAB_0010fde8:
        uVar10 = (int)inlen_00 + uVar6;
        (tls->field_20).server.early_data_skipped_bytes = uVar10;
        uVar9 = 0x202;
        if (0x10000 < uVar10) {
          return 0x28;
        }
        goto LAB_0010fdb3;
      }
      puVar1 = &(tls->traffic_protection).dec.seq;
      *puVar1 = *puVar1 + 1;
      local_88.record_header_length = (size_t)(decryptbuf->base + decryptbuf->off);
      do {
        inlen_00 = (st_ptls_traffic_protection_t *)((long)&psVar5[-1].seq + 7);
        if (psVar5 == (st_ptls_traffic_protection_t *)0x0) {
          return 10;
        }
        uVar8 = ((uint8_t *)(local_88.record_header_length + -1))[(long)psVar5];
        psVar5 = inlen_00;
      } while (uVar8 == '\0');
      local_88.buf = (ptls_buffer_t *)CONCAT71(local_88.buf._1_7_,uVar8);
      local_88.enc = inlen_00;
    }
    emitter = (ptls_message_emitter_t *)local_88.commit_message;
    if (((tls->recvbuf).mess.base == (uint8_t *)0x0) && (uVar8 != '\x16')) {
      if (uVar8 == '\x15') {
        if (inlen_00 == (st_ptls_traffic_protection_t *)0x2) {
          uVar9 = *(uint8_t *)(local_88.record_header_length + 1) | 0x100;
        }
        else {
          uVar9 = 0x32;
        }
      }
      else {
        uVar9 = 10;
        if (uVar8 == '\x17') {
          if (tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE) {
            if ((tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) &&
               (uVar9 = 0, (tls->traffic_protection).dec.aead != (ptls_aead_context_t *)0x0)) {
              decryptbuf->off = (size_t)(inlen_00->secret + decryptbuf->off);
            }
          }
          else {
            decryptbuf->off = (size_t)(inlen_00->secret + decryptbuf->off);
            uVar9 = 0;
          }
        }
      }
      goto LAB_0010fdb3;
    }
  }
  uVar9 = handle_handshake_record
                    (tls,(_func_int_ptls_t_ptr_ptls_message_emitter_t_ptr_ptls_iovec_t_int_ptls_handshake_properties_t_ptr
                          *)emitter,&local_88,(st_ptls_record_t *)properties,properties_00);
  if ((uVar9 == 0x202) && (uVar9 = 0x202, (tls->field_0x160 & 0x20) != 0)) {
    return 0x202;
  }
LAB_0010fdb3:
  ptls_buffer_dispose(&(tls->recvbuf).rec);
  return uVar9;
}

Assistant:

static int handle_input(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_buffer_t *decryptbuf, const void *input, size_t *inlen,
                        ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_t rec;
    int ret;

    if (tls->in_handshake)
        goto resume_handshake;

    /* extract the record */
    if ((ret = parse_record(tls, &rec, input, inlen)) != 0)
        return ret;
    assert(rec.fragment != NULL);

    /* decrypt the record */
    if (rec.type == PTLS_CONTENT_TYPE_CHANGE_CIPHER_SPEC) {
        if (tls->state < PTLS_STATE_POST_HANDSHAKE_MIN) {
            if (!(rec.length == 1 && rec.fragment[0] == 0x01))
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        } else {
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        ret = PTLS_ERROR_IN_PROGRESS;
        goto NextRecord;
    }
    if (tls->traffic_protection.dec.aead != NULL && rec.type != PTLS_CONTENT_TYPE_ALERT) {
        size_t decrypted_length;
        if (rec.type != PTLS_CONTENT_TYPE_APPDATA)
            return PTLS_ALERT_HANDSHAKE_FAILURE;
        if ((ret = ptls_buffer_reserve(decryptbuf, 5 + rec.length)) != 0)
            return ret;
        if ((ret = aead_decrypt(&tls->traffic_protection.dec, decryptbuf->base + decryptbuf->off, &decrypted_length, rec.fragment,
                                rec.length)) != 0) {
            if (tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX)
                goto ServerSkipEarlyData;
            return ret;
        }
        rec.length = decrypted_length;
        rec.fragment = decryptbuf->base + decryptbuf->off;
        /* skip padding */
        for (; rec.length != 0; --rec.length)
            if (rec.fragment[rec.length - 1] != 0)
                break;
        if (rec.length == 0)
            return PTLS_ALERT_UNEXPECTED_MESSAGE;
        rec.type = rec.fragment[--rec.length];
    } else if (rec.type == PTLS_CONTENT_TYPE_APPDATA && tls->is_server && tls->server.early_data_skipped_bytes != UINT32_MAX) {
        goto ServerSkipEarlyData;
    }

    if (tls->recvbuf.mess.base != NULL || rec.type == PTLS_CONTENT_TYPE_HANDSHAKE) {
        /* handshake record */
resume_handshake:
        ret = handle_handshake_record(tls, handle_handshake_message, emitter, &rec, properties);
        if ((ret == PTLS_ERROR_IN_PROGRESS) && (tls->in_handshake))
            return ret;
    } else {
        /* handling of an alert or an application record */
        switch (rec.type) {
        case PTLS_CONTENT_TYPE_APPDATA:
            if (tls->state >= PTLS_STATE_POST_HANDSHAKE_MIN) {
                decryptbuf->off += rec.length;
                ret = 0;
            } else if (tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                if (tls->traffic_protection.dec.aead != NULL)
                    decryptbuf->off += rec.length;
                ret = 0;
            } else {
                ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            }
            break;
        case PTLS_CONTENT_TYPE_ALERT:
            ret = handle_alert(tls, rec.fragment, rec.length);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
    }

NextRecord:
    ptls_buffer_dispose(&tls->recvbuf.rec);
    return ret;

ServerSkipEarlyData:
    tls->server.early_data_skipped_bytes += (uint32_t)rec.length;
    if (tls->server.early_data_skipped_bytes > PTLS_MAX_EARLY_DATA_SKIP_SIZE)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    ret = PTLS_ERROR_IN_PROGRESS;
    goto NextRecord;
}